

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

int __thiscall crnlib::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  uint new_size;
  color_quad_u8 *pcVar2;
  uint *puVar3;
  uint i_1;
  uint uVar4;
  uint *puVar5;
  results *in_RDX;
  uint i;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar13;
  undefined1 auVar12 [16];
  vec<3U,_float> local_48;
  vec3F avg_color;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  new_size = *(uint *)(ctx + 8);
  uVar7 = (ulong)new_size;
  vector<unsigned_char>::resize(&this->m_selectors,new_size,false);
  vector<unsigned_char>::resize(&this->m_best_selectors,new_size,false);
  vector<unsigned_char>::resize(&this->m_temp_selectors,new_size,false);
  vector<unsigned_char>::resize(&(this->m_trial_solution).m_selectors,new_size,false);
  vector<unsigned_char>::resize(&(this->m_best_solution).m_selectors,new_size,false);
  this->m_limit = (this->m_pParams->m_use_color4 ^ 1) << 4 | 0xf;
  vec<3U,_float>::set(&avg_color,0.0);
  vector<unsigned_short>::resize(&this->m_luma,new_size,false);
  vector<unsigned_int>::resize(this->m_sorted_luma,new_size,false);
  vector<unsigned_int>::resize(this->m_sorted_luma + 1,new_size,false);
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pcVar2 = this->m_pParams->m_pSrc_pixels;
    local_48.m_s[2] = (float)pcVar2[uVar6].field_0.field_0.b;
    local_48.m_s[0] = (float)(pcVar2[uVar6].field_0.m_u32 & 0xff);
    local_48.m_s[1] = (float)(pcVar2[uVar6].field_0.m_u32 >> 8 & 0xff);
    vec<3U,_float>::operator+=(&avg_color,&local_48);
    (this->m_luma).m_p[uVar6] =
         (ushort)pcVar2[uVar6].field_0.field_0.b +
         (ushort)pcVar2[uVar6].field_0.field_0.g + (ushort)pcVar2[uVar6].field_0.field_0.r;
    this->m_sorted_luma[0].m_p[uVar6] = (uint)uVar6;
  }
  vec<3U,_float>::operator/=(&avg_color,(float)uVar7);
  vec<3U,_float>::operator=(&this->m_avg_color,&avg_color);
  uVar4 = this->m_limit;
  fVar8 = (float)(int)uVar4;
  uVar1 = *(undefined8 *)(this->m_avg_color).m_s;
  auVar12._0_4_ = fVar8 * (float)uVar1;
  auVar12._4_4_ = fVar8 * (float)((ulong)uVar1 >> 0x20);
  auVar12._8_4_ = fVar8 * 0.0;
  auVar12._12_4_ = fVar8 * 0.0;
  auVar12 = divps(auVar12,_DAT_001952e0);
  fVar11 = auVar12._0_4_ + 0.5;
  fVar13 = auVar12._4_4_ + 0.5;
  uVar9 = (uint)fVar11;
  uVar10 = (uint)fVar13;
  uVar9 = (int)(fVar11 - 2.1474836e+09) & (int)uVar9 >> 0x1f | uVar9;
  uVar10 = (int)(fVar13 - 2.1474836e+09) & (int)uVar10 >> 0x1f | uVar10;
  this->m_br = ~-(uint)((int)uVar9 < 0) &
               (~-(uint)((int)uVar9 < (int)uVar4) & uVar4 | uVar9 & -(uint)((int)uVar9 < (int)uVar4)
               );
  this->m_bg = ~-(uint)((int)uVar10 < 0) &
               (~-(uint)((int)uVar10 < (int)uVar4) & uVar4 |
               uVar10 & -(uint)((int)uVar10 < (int)uVar4));
  uVar9 = (uint)(long)((fVar8 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if ((int)uVar9 < (int)uVar4) {
    uVar4 = uVar9;
  }
  uVar10 = 0;
  if (-1 < (int)uVar9) {
    uVar10 = uVar4;
  }
  this->m_bb = uVar10;
  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality < cCRNETCQualitySlow) {
    puVar5 = indirect_radix_sort<unsigned_int,unsigned_short>
                       (new_size,this->m_sorted_luma[0].m_p,this->m_sorted_luma[1].m_p,
                        (this->m_luma).m_p,0,2,false);
    this->m_pSorted_luma_indices = puVar5;
    puVar3 = this->m_sorted_luma[0].m_p;
    this->m_pSorted_luma = puVar3;
    if (puVar5 == puVar3) {
      this->m_pSorted_luma = this->m_sorted_luma[1].m_p;
    }
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      this->m_pSorted_luma[uVar6] = (uint)(this->m_luma).m_p[this->m_pSorted_luma_indices[uVar6]];
    }
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& params, results& result) {
  m_pParams = &params;
  m_pResult = &result;

  const uint n = m_pParams->m_num_src_pixels;

  m_selectors.resize(n);
  m_best_selectors.resize(n);
  m_temp_selectors.resize(n);
  m_trial_solution.m_selectors.resize(n);
  m_best_solution.m_selectors.resize(n);

  m_limit = m_pParams->m_use_color4 ? 15 : 31;

  vec3F avg_color(0.0f);

  m_luma.resize(n);
  m_sorted_luma[0].resize(n);
  m_sorted_luma[1].resize(n);

  for (uint i = 0; i < n; i++) {
    const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
    const vec3F fc(c.r, c.g, c.b);

    avg_color += fc;

    m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
    m_sorted_luma[0][i] = i;
  }
  avg_color /= static_cast<float>(n);
  m_avg_color = avg_color;

  m_br = math::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
  m_bg = math::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
  m_bb = math::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

  if (m_pParams->m_quality <= cCRNETCQualityMedium) {
    m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0].get_ptr(), m_sorted_luma[1].get_ptr(), m_luma.get_ptr(), 0, sizeof(m_luma[0]), false);
    m_pSorted_luma = m_sorted_luma[0].get_ptr();
    if (m_pSorted_luma_indices == m_sorted_luma[0].get_ptr())
      m_pSorted_luma = m_sorted_luma[1].get_ptr();

    for (uint i = 0; i < n; i++)
      m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
  }

  m_best_solution.m_coords.clear();
  m_best_solution.m_valid = false;
  m_best_solution.m_error = cUINT64_MAX;
}